

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbeUnbind(Vdbe *p,int i)

{
  uint uVar1;
  Mem *p_00;
  sqlite3_mutex *psVar2;
  sqlite3 *psVar3;
  int iVar4;
  uint uVar5;
  undefined8 uVar6;
  
  iVar4 = vdbeSafetyNotNull(p);
  if (iVar4 == 0) {
    psVar2 = p->db->mutex;
    if (psVar2 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar2);
    }
    if (p->eVdbeState == '\x01') {
      if ((i < 1) || (p->nVar < i)) {
        psVar3 = p->db;
        psVar3->errCode = 0x19;
        sqlite3ErrorFinish(psVar3,0x19);
        psVar2 = p->db->mutex;
        if (psVar2 == (sqlite3_mutex *)0x0) {
          return 0x19;
        }
        (*sqlite3Config.mutex.xMutexLeave)(psVar2);
        return 0x19;
      }
      uVar1 = i - 1;
      p_00 = p->aVar + uVar1;
      if (((p->aVar[uVar1].flags & 0x9000) != 0) || (p_00->szMalloc != 0)) {
        vdbeMemClear(p_00);
      }
      p_00->flags = 1;
      p->db->errCode = 0;
      if (p->expmask == 0) {
        return 0;
      }
      uVar5 = 0x80000000;
      if (i < 0x20) {
        uVar5 = 1 << ((byte)uVar1 & 0x1f);
      }
      if ((p->expmask & uVar5) == 0) {
        return 0;
      }
      p->field_0xc6 = (p->field_0xc6 & 0xfc) + 1;
      return 0;
    }
    psVar3 = p->db;
    psVar3->errCode = 0x15;
    sqlite3ErrorFinish(psVar3,0x15);
    psVar2 = p->db->mutex;
    if (psVar2 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar2);
    }
    sqlite3_log(0x15,"bind on a busy prepared statement: [%s]",p->zSql);
    uVar6 = 0x15592;
  }
  else {
    uVar6 = 0x1558a;
  }
  sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",uVar6,
              "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
  return 0x15;
}

Assistant:

static int vdbeUnbind(Vdbe *p, int i){
  Mem *pVar;
  if( vdbeSafetyNotNull(p) ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(p->db->mutex);
  if( p->eVdbeState!=VDBE_READY_STATE ){
    sqlite3Error(p->db, SQLITE_MISUSE);
    sqlite3_mutex_leave(p->db->mutex);
    sqlite3_log(SQLITE_MISUSE,
        "bind on a busy prepared statement: [%s]", p->zSql);
    return SQLITE_MISUSE_BKPT;
  }
  if( i<1 || i>p->nVar ){
    sqlite3Error(p->db, SQLITE_RANGE);
    sqlite3_mutex_leave(p->db->mutex);
    return SQLITE_RANGE;
  }
  i--;
  pVar = &p->aVar[i];
  sqlite3VdbeMemRelease(pVar);
  pVar->flags = MEM_Null;
  p->db->errCode = SQLITE_OK;

  /* If the bit corresponding to this variable in Vdbe.expmask is set, then
  ** binding a new value to this variable invalidates the current query plan.
  **
  ** IMPLEMENTATION-OF: R-57496-20354 If the specific value bound to a host
  ** parameter in the WHERE clause might influence the choice of query plan
  ** for a statement, then the statement will be automatically recompiled,
  ** as if there had been a schema change, on the first sqlite3_step() call
  ** following any change to the bindings of that parameter.
  */
  assert( (p->prepFlags & SQLITE_PREPARE_SAVESQL)!=0 || p->expmask==0 );
  if( p->expmask!=0 && (p->expmask & (i>=31 ? 0x80000000 : (u32)1<<i))!=0 ){
    p->expired = 1;
  }
  return SQLITE_OK;
}